

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  ImVec4 *pIVar2;
  ImVec4 *pIVar3;
  int iVar4;
  int iVar5;
  ImGuiTable *pIVar6;
  ImGuiWindow *pIVar7;
  ImGuiWindowStackData *pIVar8;
  ImGuiTabBar *pIVar9;
  char *pcVar10;
  ImGuiColorMod *pIVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  uint uVar17;
  char *pcVar18;
  long lVar19;
  
  pIVar15 = GImGui;
  pIVar6 = GImGui->CurrentTable;
  while (pIVar6 != (ImGuiTable *)0x0) {
    if ((pIVar6->OuterWindow != pIVar15->CurrentWindow) &&
       (pIVar6->InnerWindow != pIVar15->CurrentWindow)) break;
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                      pIVar6->OuterWindow->Name);
    }
    EndTable();
    pIVar6 = pIVar15->CurrentTable;
  }
  pIVar7 = pIVar15->CurrentWindow;
  iVar4 = (pIVar15->CurrentWindowStack).Size;
  pIVar8 = (pIVar15->CurrentWindowStack).Data;
  pIVar9 = pIVar15->CurrentTabBar;
  while (pIVar9 != (ImGuiTabBar *)0x0) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar7->Name);
    }
    EndTabBar();
    pIVar9 = pIVar15->CurrentTabBar;
  }
  iVar5 = (pIVar7->DC).TreeDepth;
  while (0 < iVar5) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar7->Name);
    }
    TreePop();
    iVar5 = (pIVar7->DC).TreeDepth;
  }
  if ((int)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfGroupStack < (pIVar15->GroupStack).Size)
  {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar7->Name);
      }
      EndGroup();
    } while ((int)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfGroupStack <
             (pIVar15->GroupStack).Size);
  }
  iVar5 = (pIVar7->IDStack).Size;
  while (1 < iVar5) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar7->Name);
    }
    pIVar1 = &GImGui->CurrentWindow->IDStack;
    pIVar1->Size = pIVar1->Size + -1;
    iVar5 = (pIVar7->IDStack).Size;
  }
  if (pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfDisabledStack < pIVar15->DisabledStackSize) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndDisabled() in \'%s\'",pIVar7->Name);
      }
      EndDisabled();
    } while (pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfDisabledStack <
             pIVar15->DisabledStackSize);
  }
  while (iVar5 = (pIVar15->ColorStack).Size,
        pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfColorStack < iVar5) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      pcVar10 = pIVar7->Name;
      pcVar18 = GetStyleColorName((pIVar15->ColorStack).Data[(long)iVar5 + -1].Col);
      (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                      pcVar10,pcVar18);
    }
    pIVar16 = GImGui;
    lVar19 = (long)(GImGui->ColorStack).Size;
    pIVar11 = (GImGui->ColorStack).Data;
    pIVar2 = &pIVar11[lVar19 + -1].BackupValue;
    fVar12 = pIVar2->y;
    fVar13 = pIVar2->z;
    fVar14 = pIVar2->w;
    pIVar3 = (GImGui->Style).Colors + pIVar11[lVar19 + -1].Col;
    pIVar3->x = pIVar2->x;
    pIVar3->y = fVar12;
    pIVar3->z = fVar13;
    pIVar3->w = fVar14;
    (pIVar16->ColorStack).Size = (pIVar16->ColorStack).Size + -1;
  }
  uVar17 = (uint)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfItemFlagsStack;
  if ((int)uVar17 < (pIVar15->ItemFlagsStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopItemFlag() in \'%s\'",pIVar7->Name);
        uVar17 = (uint)(ushort)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfItemFlagsStack;
      }
      pIVar16 = GImGui;
      iVar5 = (GImGui->ItemFlagsStack).Size;
      (GImGui->ItemFlagsStack).Size = iVar5 + -1;
      pIVar16->CurrentItemFlags = (pIVar16->ItemFlagsStack).Data[(long)iVar5 + -2];
    } while ((int)(short)uVar17 < (pIVar15->ItemFlagsStack).Size);
  }
  if ((int)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
      (pIVar15->StyleVarStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar7->Name);
      }
      PopStyleVar(1);
    } while ((int)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
             (pIVar15->StyleVarStack).Size);
  }
  uVar17 = (uint)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfFocusScopeStack;
  if ((int)uVar17 < (pIVar15->FocusScopeStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar7->Name);
        uVar17 = (uint)(ushort)pIVar8[(long)iVar4 + -1].StackSizesOnBegin.SizeOfFocusScopeStack;
      }
      pIVar16 = GImGui;
      iVar5 = (GImGui->FocusScopeStack).Size;
      (GImGui->CurrentWindow->DC).NavFocusScopeIdCurrent =
           (GImGui->FocusScopeStack).Data[(long)iVar5 + -1];
      (pIVar16->FocusScopeStack).Size = iVar5 + -1;
    } while ((int)(short)uVar17 < (pIVar15->FocusScopeStack).Size);
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        EndDisabled();
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}